

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O3

void split_rects(nhrect *r1,nhrect *r2)

{
  long lVar1;
  char cVar2;
  xchar xVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  nhrect *pnVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  char cVar14;
  char cVar15;
  int iVar16;
  int iVar17;
  nhrect *r1_00;
  char cVar18;
  undefined8 local_38;
  
  cVar2 = r1->ly;
  xVar3 = r1->hx;
  local_38._0_2_ = CONCAT11(r1->hy,r1->lx);
  uVar11 = get_rect_ind(r1);
  local_38._0_6_ = (uint6)(ushort)local_38;
  uVar12 = rect_cnt;
  if (-1 < (int)uVar11) {
    lVar13 = (long)rect_cnt;
    uVar12 = rect_cnt - 1;
    rect_cnt = uVar12;
    rect[uVar11] = *(nhrect *)(&DAT_0035c71c + lVar13 * 4);
  }
  local_38 = CONCAT17(cVar2,CONCAT16(xVar3,(uint6)local_38));
  if (0 < (int)uVar12) {
    lVar13 = 1;
    pnVar9 = rect + uVar12;
    do {
      uVar10 = local_38;
      r1_00 = pnVar9 + -1;
      cVar4 = r2->lx;
      cVar15 = pnVar9[-1].hx;
      if (cVar4 <= cVar15) {
        cVar5 = r2->ly;
        cVar6 = pnVar9[-1].hy;
        if (cVar5 <= cVar6) {
          cVar7 = r2->hx;
          cVar18 = r1_00->lx;
          if (cVar18 <= cVar7) {
            cVar8 = r2->hy;
            cVar14 = pnVar9[-1].ly;
            if (cVar14 <= cVar8) {
              if (cVar18 < cVar4) {
                cVar18 = cVar4;
              }
              local_38._0_3_ = CONCAT12(cVar18,(ushort)local_38);
              if (cVar14 < cVar5) {
                cVar14 = cVar5;
              }
              local_38._0_4_ = CONCAT13(cVar14,(uint3)local_38);
              if (cVar7 < cVar15) {
                cVar15 = cVar7;
              }
              local_38._0_5_ = CONCAT14(cVar15,(uint)local_38);
              if (cVar8 < cVar6) {
                cVar6 = cVar8;
              }
              local_38._6_2_ = SUB82(uVar10,6);
              local_38._0_6_ = CONCAT15(cVar6,(uint5)local_38);
              if ((cVar18 <= cVar15) && (cVar14 <= cVar6)) {
                split_rects(r1_00,(nhrect *)((long)&local_38 + 2));
              }
            }
          }
        }
      }
      lVar1 = (ulong)uVar12 + lVar13;
      lVar13 = lVar13 + -1;
      pnVar9 = r1_00;
    } while (1 < lVar1 - 1U);
  }
  cVar4 = (char)local_38;
  iVar17 = (int)(char)local_38;
  cVar5 = local_38._7_1_;
  cVar15 = local_38._6_1_;
  if ((int)cVar2 - (int)r2->ly < (int)((uint)('\x13' < local_38._1_1_) * 2 | 0xfffffff5)) {
    local_38._0_3_ = CONCAT12(cVar4,(ushort)local_38);
    local_38._0_4_ = CONCAT13(local_38._7_1_,(uint3)local_38);
    local_38._0_5_ = CONCAT14(local_38._6_1_,(uint)local_38);
    local_38 = (ulong)(uint5)local_38;
    add_rect((nhrect *)((long)&local_38 + 2));
  }
  iVar16 = (int)local_38._1_1_;
  if (iVar17 - r2->lx < (int)((uint)('N' < cVar15) * 3 + -0xd)) {
    local_38._0_3_ = (uint3)(ushort)local_38;
    local_38._0_4_ = CONCAT13(cVar5,(uint3)local_38);
    local_38 = (ulong)(uint)local_38;
    add_rect((nhrect *)((long)&local_38 + 2));
  }
  if (r2->hy - iVar16 < (int)((uint)(cVar5 < '\x01') * 2 | 0xfffffff5)) {
    add_rect((nhrect *)((long)&local_38 + 2));
  }
  if ((int)r2->hx - (int)cVar15 < (int)((uint)((char)local_38 < '\x01') * 3 + -0xd)) {
    add_rect((nhrect *)((long)&local_38 + 2));
  }
  return;
}

Assistant:

void split_rects(struct nhrect *r1, struct nhrect *r2)
{
	struct nhrect r, old_r;
	int i;

	old_r = *r1;
	remove_rect(r1);

	/* Walk down since rect_cnt & rect[] will change... */
	for (i=rect_cnt-1; i>=0; i--)
	    if (intersect(&rect[i], r2, &r))
		split_rects(&rect[i], &r);
	
	if (r2->ly - old_r.ly-1 > (old_r.hy < ROWNO - 1 ? 2*YLIM : YLIM+1)+4) {
		r = old_r;
		r.hy = r2->ly - 2;
		add_rect(&r);
	}
	if (r2->lx - old_r.lx-1 > (old_r.hx < COLNO - 1 ? 2*XLIM : XLIM+1)+4) {
		r = old_r;
		r.hx = r2->lx - 2;
		add_rect(&r);
	}
	if (old_r.hy - r2->hy-1 > (old_r.ly > 0 ? 2*YLIM : YLIM+1)+4) {
		r = old_r;
		r.ly = r2->hy + 2;
		add_rect(&r);
	}
	if (old_r.hx - r2->hx-1 > (old_r.lx > 0 ? 2*XLIM : XLIM+1)+4) {
		r = old_r;
		r.lx = r2->hx + 2;
		add_rect(&r);
	}
}